

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondGeometric.cpp
# Opt level: O3

void __thiscall OpenMD::HBondGeometric::writeHistogram(HBondGeometric *this)

{
  pointer pcVar1;
  char cVar2;
  ostream *poVar3;
  long lVar4;
  ofstream osq;
  long *local_248 [2];
  long local_238 [2];
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream
            (&local_228,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    pcVar1 = (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p;
    local_248[0] = local_238;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_248,pcVar1,
               pcVar1 + (this->super_StaticAnalyser).outputFilename_._M_string_length);
    std::__cxx11::string::append((char *)local_248);
    snprintf(painCave.errMsg,2000,"HBondGeometric: unable to open %s\n",local_248[0]);
    if (local_248[0] != local_238) {
      operator_delete(local_248[0],local_238[0] + 1);
    }
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_228,"# HydrogenBonding Statistics\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"# selection1: (",0xf);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_228,(this->selectionScript1_)._M_dataplus._M_p,
                        (this->selectionScript1_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tselection2: (",0xe);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(this->selectionScript2_)._M_dataplus._M_p,
                        (this->selectionScript2_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_228,"# molecules in selection1: ",0x1b);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&local_228,this->nSelected_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_228,
               "# nHBonds\tnAcceptor\tnDonor\tp(nHBonds)\tp(nAcceptor)\tp(nDonor)\n",0x3d);
    if (0 < this->nBins_) {
      lVar4 = 0;
      do {
        std::ostream::operator<<((ostream *)&local_228,(int)lVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"\t",1);
        std::ostream::operator<<
                  ((ostream *)&local_228,
                   (this->nHBonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar4]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"\t",1);
        std::ostream::operator<<
                  ((ostream *)&local_228,
                   (this->nAcceptor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar4]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"\t",1);
        std::ostream::operator<<
                  ((ostream *)&local_228,
                   (this->nDonor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar4]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"\t",1);
        std::ostream::_M_insert<double>
                  ((double)(this->nHBonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar4] / (double)this->nSelected_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"\t",1);
        std::ostream::_M_insert<double>
                  ((double)(this->nAcceptor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar4] / (double)this->nSelected_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"\t",1);
        std::ostream::_M_insert<double>
                  ((double)(this->nDonor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar4] / (double)this->nSelected_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"\n",1);
        lVar4 = lVar4 + 1;
      } while (lVar4 < this->nBins_);
    }
    std::ofstream::close();
  }
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void HBondGeometric::writeHistogram() {
    std::ofstream osq(getOutputFileName().c_str());

    if (osq.is_open()) {
      osq << "# HydrogenBonding Statistics\n";
      osq << "# selection1: (" << selectionScript1_ << ")"
          << "\tselection2: (" << selectionScript2_ << ")\n";
      osq << "# molecules in selection1: " << nSelected_ << "\n";
      osq << "# "
             "nHBonds\tnAcceptor\tnDonor\tp(nHBonds)\tp(nAcceptor)\tp(nDonor)"
             "\n";
      // Normalize by number of frames and write it out:
      for (int i = 0; i < nBins_; ++i) {
        osq << i;
        osq << "\t" << nHBonds_[i];
        osq << "\t" << nAcceptor_[i];
        osq << "\t" << nDonor_[i];
        osq << "\t" << (RealType)(nHBonds_[i]) / nSelected_;
        osq << "\t" << (RealType)(nAcceptor_[i]) / nSelected_;
        osq << "\t" << (RealType)(nDonor_[i]) / nSelected_;
        osq << "\n";
      }
      osq.close();

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "HBondGeometric: unable to open %s\n",
               (getOutputFileName() + "q").c_str());
      painCave.isFatal = 1;
      simError();
    }
  }